

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::UndoReadFromDisk(BlockManager *this,CBlockUndo *blockundo,CBlockIndex *index)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  exception *e;
  FlatFilePos pos;
  AutoFile filein;
  HashVerifier<AutoFile> verifier;
  uint256 hashChecksum;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  AutoFile *in_stack_fffffffffffffd80;
  CBlockIndex *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd98;
  anon_class_8_1_a81517f2 *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  BlockManager *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined8 in_stack_fffffffffffffde8;
  int iVar3;
  bool local_1e1;
  ConstevalFormatString<2U> in_stack_fffffffffffffe28;
  string_view in_stack_fffffffffffffe30;
  string_view in_stack_fffffffffffffe40;
  undefined1 local_168 [136];
  Level in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff30) [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  UndoReadFromDisk::anon_class_8_1_a81517f2::operator()(in_stack_fffffffffffffda0);
  OpenUndoFile(in_stack_fffffffffffffdc8,
               (FlatFilePos *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               SUB81((ulong)local_168 >> 0x38,0));
  bVar2 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                          );
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    iVar3 = 0;
    FlatFilePos::ToString_abi_cxx11_((FlatFilePos *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd78 = 4;
    LogPrintFormatInternal<char[17],std::__cxx11::string>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe30,iVar3,
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_ffffffffffffff20,in_stack_fffffffffffffe28,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_1e1 = false;
  }
  else {
    uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    HashVerifier<AutoFile>::HashVerifier
              ((HashVerifier<AutoFile> *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffd88);
    HashWriter::operator<<
              ((HashWriter *)in_stack_fffffffffffffd88,(uint256 *)in_stack_fffffffffffffd80);
    HashVerifier<AutoFile>::operator>>
              ((HashVerifier<AutoFile> *)in_stack_fffffffffffffd88,
               (CBlockUndo *)in_stack_fffffffffffffd80);
    AutoFile::operator>>((AutoFile *)in_stack_fffffffffffffd88,(uint256 *)in_stack_fffffffffffffd80)
    ;
    HashWriter::GetHash((HashWriter *)in_stack_fffffffffffffd98);
    bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffd88,
                         (base_blob<256U> *)in_stack_fffffffffffffd80);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      FlatFilePos::ToString_abi_cxx11_((FlatFilePos *)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd78 = 4;
      LogPrintFormatInternal<char[17],std::__cxx11::string>
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe30,iVar3,
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_ffffffffffffff20,in_stack_fffffffffffffe28,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_1e1 = false;
    }
    else {
      local_1e1 = true;
    }
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1e1;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::UndoReadFromDisk(CBlockUndo& blockundo, const CBlockIndex& index) const
{
    const FlatFilePos pos{WITH_LOCK(::cs_main, return index.GetUndoPos())};

    // Open history file to read
    AutoFile filein{OpenUndoFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenUndoFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    uint256 hashChecksum;
    HashVerifier verifier{filein}; // Use HashVerifier as reserializing may lose data, c.f. commit d342424301013ec47dc146a4beb49d5c9319d80a
    try {
        verifier << index.pprev->GetBlockHash();
        verifier >> blockundo;
        filein >> hashChecksum;
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Verify checksum
    if (hashChecksum != verifier.GetHash()) {
        LogError("%s: Checksum mismatch at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}